

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O2

void __thiscall dtc::dtb::binary_writer::write_data(binary_writer *this,uint32_t v)

{
  ulong in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while ((*(int *)&(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
          *(int *)&(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start & 3U) != 0) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->buffer,(uchar *)((long)&uStack_28 + 7));
  }
  push_big_endian<unsigned_int>(&this->buffer,v);
  return;
}

Assistant:

void
binary_writer::write_data(uint32_t v)
{
	while (buffer.size() % 4 != 0)
	{
		buffer.push_back(0);
	}
	push_big_endian(buffer, v);
}